

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O0

void nn_streamhdr_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint16_t uVar1;
  int iVar2;
  nn_fsm *local_48;
  undefined1 auStack_38 [4];
  int protocol;
  nn_iovec iovec;
  nn_streamhdr *streamhdr;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_48 = self;
  if (self == (nn_fsm *)0x0) {
    local_48 = (nn_fsm *)0x0;
  }
  iovec.iov_len = (size_t)local_48;
  switch(*(undefined4 *)&local_48[1].fn) {
  case 1:
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_48[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
              ,0xa8);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_48[1].fn,0xfffffffe,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
              ,0xa4);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_timer_start((nn_timer *)&local_48[1].shutdown_fn,1000);
    _auStack_38 = (void *)(iovec.iov_len + 0x168);
    iovec.iov_base = (void *)0x8;
    nn_usock_send(*(nn_usock **)(iovec.iov_len + 0x148),(nn_iovec *)auStack_38,1);
    *(undefined4 *)(iovec.iov_len + 0x58) = 2;
    break;
  case 2:
    if (src == 1) {
      if (type == 3) {
        nn_usock_recv((nn_usock *)local_48[3].stopped.srcptr,&local_48[4].shutdown_fn,8,(int *)0x0);
        *(undefined4 *)(iovec.iov_len + 0x58) = 3;
      }
      else if (type == 5) {
        nn_timer_stop((nn_timer *)&local_48[1].shutdown_fn);
        *(undefined4 *)(iovec.iov_len + 0x58) = 4;
      }
      else if (type != 8) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_48[1].fn,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0xc0);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)&local_48[1].fn,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0xce);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_48[1].fn,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0xca);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop((nn_timer *)&local_48[1].shutdown_fn);
      *(undefined4 *)(iovec.iov_len + 0x58) = 4;
    }
    break;
  case 3:
    if (src == 1) {
      if (type == 4) {
        if (*(int *)&local_48[4].shutdown_fn == 0x505300) {
          uVar1 = nn_gets((uint8_t *)((long)&local_48[4].shutdown_fn + 4));
          iVar2 = nn_pipebase_ispeer(*(nn_pipebase **)(iovec.iov_len + 0x160),(uint)uVar1);
          if (iVar2 != 0) {
            nn_timer_stop((nn_timer *)(iovec.iov_len + 0x60));
            *(undefined4 *)(iovec.iov_len + 0x58) = 5;
            return;
          }
        }
      }
      else if (type != 5) {
        if (type == 8) {
          return;
        }
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0xee);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop((nn_timer *)(iovec.iov_len + 0x60));
      *(undefined4 *)(iovec.iov_len + 0x58) = 4;
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)&local_48[1].fn,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0xfc);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_48[1].fn,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0xf8);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop((nn_timer *)&local_48[1].shutdown_fn);
      *(undefined4 *)(iovec.iov_len + 0x58) = 4;
    }
    break;
  case 4:
    if (src == 1) {
      if (type != 5) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_USOCK_ERROR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0x108);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)&local_48[1].fn,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0x11b);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_48[1].fn,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0x117);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_swap_owner((nn_usock *)local_48[3].stopped.srcptr,
                          (nn_fsm_owner *)&local_48[3].stopped.type);
      *(undefined8 *)(iovec.iov_len + 0x148) = 0;
      *(undefined4 *)(iovec.iov_len + 0x150) = 0xffffffff;
      *(undefined8 *)(iovec.iov_len + 0x158) = 0;
      *(undefined4 *)(iovec.iov_len + 0x58) = 6;
      nn_fsm_raise((nn_fsm *)iovec.iov_len,(nn_fsm_event *)(iovec.iov_len + 0x170),2);
    }
    break;
  case 5:
    if (src == 1) {
      if (type != 5) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_USOCK_ERROR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0x127);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)&local_48[1].fn,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0x13a);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_48[1].fn,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
                ,0x136);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_swap_owner((nn_usock *)local_48[3].stopped.srcptr,
                          (nn_fsm_owner *)&local_48[3].stopped.type);
      *(undefined8 *)(iovec.iov_len + 0x148) = 0;
      *(undefined4 *)(iovec.iov_len + 0x150) = 0xffffffff;
      *(undefined8 *)(iovec.iov_len + 0x158) = 0;
      *(undefined4 *)(iovec.iov_len + 0x58) = 6;
      nn_fsm_raise((nn_fsm *)iovec.iov_len,(nn_fsm_event *)(iovec.iov_len + 0x170),1);
    }
    break;
  case 6:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
            (ulong)*(uint *)&local_48[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
            ,0x143);
    fflush(_stderr);
    nn_err_abort();
  default:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&local_48[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
            ,0x149);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_streamhdr_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_streamhdr *streamhdr;
    struct nn_iovec iovec;
    int protocol;

    streamhdr = nn_cont (self, struct nn_streamhdr, fsm);


    switch (streamhdr->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_STREAMHDR_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_timer_start (&streamhdr->timer, 1000);
                iovec.iov_base = streamhdr->protohdr;
                iovec.iov_len = sizeof (streamhdr->protohdr);
                nn_usock_send (streamhdr->usock, &iovec, 1);
                streamhdr->state = NN_STREAMHDR_STATE_SENDING;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  SENDING state.                                                            */
/******************************************************************************/
    case NN_STREAMHDR_STATE_SENDING:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                nn_usock_recv (streamhdr->usock, streamhdr->protohdr,
                    sizeof (streamhdr->protohdr), NULL);
                streamhdr->state = NN_STREAMHDR_STATE_RECEIVING;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it. Wait for ERROR event  */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  RECEIVING state.                                                          */
/******************************************************************************/
    case NN_STREAMHDR_STATE_RECEIVING:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:

                /*  Here we are checking whether the peer speaks the same
                    protocol as this socket. */
                if (memcmp (streamhdr->protohdr, "\0SP\0", 4) != 0)
                    goto invalidhdr;
                protocol = nn_gets (streamhdr->protohdr + 4);
                if (!nn_pipebase_ispeer (streamhdr->pipebase, protocol))
                    goto invalidhdr;
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it. Wait for ERROR event  */
                return;
            case NN_USOCK_ERROR:
invalidhdr:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_assert (0);
            }

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            /*  It's safe to ignore usock event when we are stopping, but there
                is only a subset of events that are plausible. */
            nn_assert (type == NN_USOCK_ERROR);
            return;

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_usock_swap_owner (streamhdr->usock, &streamhdr->usock_owner);
                streamhdr->usock = NULL;
                streamhdr->usock_owner.src = -1;
                streamhdr->usock_owner.fsm = NULL;
                streamhdr->state = NN_STREAMHDR_STATE_DONE;
                nn_fsm_raise (&streamhdr->fsm, &streamhdr->done,
                    NN_STREAMHDR_ERROR);
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_STREAMHDR_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            /*  It's safe to ignore usock event when we are stopping, but there
                is only a subset of events that are plausible. */
            nn_assert (type == NN_USOCK_ERROR);
            return;

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_usock_swap_owner (streamhdr->usock, &streamhdr->usock_owner);
                streamhdr->usock = NULL;
                streamhdr->usock_owner.src = -1;
                streamhdr->usock_owner.fsm = NULL;
                streamhdr->state = NN_STREAMHDR_STATE_DONE;
                nn_fsm_raise (&streamhdr->fsm, &streamhdr->done,
                    NN_STREAMHDR_OK);
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_STREAMHDR_STATE_DONE:
        nn_fsm_bad_source (streamhdr->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (streamhdr->state, src, type);
    }
}